

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParametersTest::iterate(GetParametersTest *this)

{
  GLenum GVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  size_t sVar9;
  char *pcVar10;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar11;
  GLuint renderbuffer;
  GLint parameter_dsa;
  GLint parameter_legacy;
  undefined4 local_1ec;
  int local_1e8;
  int local_1e4;
  ulong local_1e0;
  GetParametersTest *local_1d8;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  long lVar8;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  local_1d8 = this;
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    local_1e0 = 0;
    bVar3 = true;
    do {
      local_1ec = 0;
      (**(code **)(lVar8 + 0x6e8))(1,&local_1ec);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGenRenderbuffers has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22ef);
      (**(code **)(lVar8 + 0xa0))(0x8d41,local_1ec);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glBindRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22f2);
      GVar1 = iterate::internalformats[local_1e0];
      (**(code **)(lVar8 + 0x1238))(0x8d41,GVar1,1,2);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glRenderbufferStorage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22f5);
      lVar11 = 0;
      do {
        local_1e4 = 0;
        local_1e8 = 0;
        uVar2 = *(undefined4 *)
                 ((long)GetParameterErrorsTest::PrepareObjects()::valid_parameters + lVar11);
        (**(code **)(lVar8 + 0xa30))(0x8d41,uVar2,&local_1e4);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glGetRenderbufferParameteriv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x230a);
        (**(code **)(lVar8 + 0x950))(local_1ec,uVar2,&local_1e8);
        GVar7 = (**(code **)(lVar8 + 0x800))();
        if (GVar7 == 0) {
          if (local_1e4 != local_1e8) {
            local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"GetNamedRenderbufferParameteriv returned ",0x29);
            std::ostream::operator<<((ostringstream *)local_1a8,local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", but ",6);
            std::ostream::operator<<((ostringstream *)local_1a8,local_1e4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," was expected for ",0x12);
            pcVar10 = iterate::pnames_strings[local_1e0];
            sVar9 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       " parameter name of renderbuffer with  internalformat = ",0x37);
            local_1d0.m_getName = glu::getInternalFormatParameterName;
            local_1d0.m_value = GVar1;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,", width = 1, height = 2.",0x18);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar3 = false;
          }
        }
        else {
          local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"GetNamedRenderbufferParameteriv unexpectedly generated ",
                     0x37);
          local_1d0.m_getName = glu::getErrorName;
          local_1d0.m_value = GVar7;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," error when called with ",0x18);
          pcVar10 = iterate::pnames_strings[local_1e0];
          sVar9 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," parameter name of renderbuffer with  internalformat = ",
                     0x37);
          local_1c0.m_getName = glu::getInternalFormatParameterName;
          local_1c0.m_value = GVar1;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,", width = 1, height = 2.",0x18);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar3 = false;
        }
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x10);
      (**(code **)(lVar8 + 0x460))(1,&local_1ec);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glDeleteRenderbuffers has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x232a);
      local_1ec = 0;
      bVar4 = local_1e0 < 3;
      local_1e0 = local_1e0 + 1;
    } while (local_1e0 != 4);
    local_1e0 = 4;
    do {
      iVar5 = (**(code **)(lVar8 + 0x800))();
    } while (iVar5 != 0);
    this_00 = (local_1d8->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      pcVar10 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else if (bVar4) {
      pcVar10 = "Error";
      testResult = QP_TEST_RESULT_INTERNAL_ERROR;
    }
    else {
      pcVar10 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (local_1d8->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar10 = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,pcVar10);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetParametersTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test renderbuffer. */
	glw::GLuint renderbuffer = 0;

	/* Test. */
	try
	{
		static const glw::GLenum internalformats[] = { GL_RGBA8, GL_DEPTH_COMPONENT24, GL_STENCIL_INDEX8,
													   GL_DEPTH24_STENCIL8 };

		static const glw::GLuint internalformats_count = sizeof(internalformats) / sizeof(internalformats[0]);

		for (glw::GLuint i = 0; i < internalformats_count; ++i)
		{
			gl.genRenderbuffers(1, &renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

			gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			gl.renderbufferStorage(GL_RENDERBUFFER, internalformats[i], 1, 2);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			static const glw::GLenum pnames[] = { GL_RENDERBUFFER_WIDTH,		   GL_RENDERBUFFER_HEIGHT,
												  GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RENDERBUFFER_SAMPLES,
												  GL_RENDERBUFFER_RED_SIZE,		   GL_RENDERBUFFER_GREEN_SIZE,
												  GL_RENDERBUFFER_BLUE_SIZE,	   GL_RENDERBUFFER_ALPHA_SIZE,
												  GL_RENDERBUFFER_DEPTH_SIZE,	  GL_RENDERBUFFER_STENCIL_SIZE };

			static const glw::GLchar* pnames_strings[] = {
				"GL_RENDERBUFFER_WIDTH",	   "GL_RENDERBUFFER_HEIGHT",	 "GL_RENDERBUFFER_INTERNAL_FORMAT",
				"GL_RENDERBUFFER_SAMPLES",	 "GL_RENDERBUFFER_RED_SIZE",   "GL_RENDERBUFFER_GREEN_SIZE",
				"GL_RENDERBUFFER_BLUE_SIZE",   "GL_RENDERBUFFER_ALPHA_SIZE", "GL_RENDERBUFFER_DEPTH_SIZE",
				"GL_RENDERBUFFER_STENCIL_SIZE"
			};

			for (glw::GLuint j = 0; j < internalformats_count; ++j)
			{
				glw::GLint parameter_legacy = 0;
				glw::GLint parameter_dsa	= 0;

				gl.getRenderbufferParameteriv(GL_RENDERBUFFER, pnames[j], &parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetRenderbufferParameteriv has failed");

				gl.getNamedRenderbufferParameteriv(renderbuffer, pnames[j], &parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedRenderbufferParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << pnames_strings[i]
						<< " parameter name of renderbuffer with  internalformat = "
						<< glu::getInternalFormatParameterStr(internalformats[i]) << ", width = 1, height = 2."
						<< tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (parameter_legacy != parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedRenderbufferParameteriv returned " << parameter_dsa
						<< ", but " << parameter_legacy << " was expected for " << pnames_strings[i]
						<< " parameter name of renderbuffer with  internalformat = "
						<< glu::getInternalFormatParameterStr(internalformats[i]) << ", width = 1, height = 2."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}

			gl.deleteRenderbuffers(1, &renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteRenderbuffers has failed");

			renderbuffer = 0;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (renderbuffer)
	{
		gl.deleteRenderbuffers(1, &renderbuffer);
	}

	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}